

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_draw_new(t_radio *x,_glist *glist)

{
  _glist *p_Var1;
  ulong in_stack_fffffffffffffe00;
  ulong in_stack_fffffffffffffe08;
  char **local_1d8;
  char *tags [4];
  char tag_object [128];
  char tag [128];
  char tag_n [128];
  int local_2c;
  int i;
  _glist *canvas;
  _glist *glist_local;
  t_radio *x_local;
  
  p_Var1 = glist_getcanvas(glist);
  local_1d8 = tags + 3;
  tags[0] = tag_object + 0x78;
  tags[1] = tag + 0x78;
  tags[2] = "text";
  sprintf((char *)(tags + 3),"%lxOBJ",x);
  for (local_2c = 0; local_2c < x->x_number; local_2c = local_2c + 1) {
    sprintf(tag_object + 0x78,"%lxBASE",x);
    sprintf(tag + 0x78,"%lxBASE%d",x);
    in_stack_fffffffffffffe00 = in_stack_fffffffffffffe00 & 0xffffffff00000000;
    in_stack_fffffffffffffe08 = in_stack_fffffffffffffe08 & 0xffffffff00000000;
    pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,in_stack_fffffffffffffe00,
                in_stack_fffffffffffffe08,"-tags",3,&local_1d8);
    sprintf(tag_object + 0x78,"%lxBUT",x);
    sprintf(tag + 0x78,"%lxBUT%d",x);
    in_stack_fffffffffffffe00 = in_stack_fffffffffffffe00 & 0xffffffff00000000;
    in_stack_fffffffffffffe08 = in_stack_fffffffffffffe08 & 0xffffffff00000000;
    pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,in_stack_fffffffffffffe00,
                in_stack_fffffffffffffe08,"-tags",3,&local_1d8);
  }
  sprintf(tag_object + 0x78,"%lxBUT",x);
  sprintf(tag + 0x78,"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crss",p_Var1,"raise",tag_object + 0x78,tag + 0x78);
  sprintf(tag_object + 0x78,"%lxLABEL",x);
  sprintf(tag + 0x78,"label");
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",4,
              &local_1d8);
  radio_draw_config(x,glist);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,6);
  return;
}

Assistant:

static void radio_draw_new(t_radio *x, t_glist *glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    int i;
    char tag_n[128], tag[128], tag_object[128];
    char *tags[] = {tag_object, tag, tag_n, "text"};
    sprintf(tag_object, "%lxOBJ", x);

    for(i=0; i<x->x_number; i++) {
        sprintf(tag, "%lxBASE", x);
        sprintf(tag_n, "%lxBASE%d", x, i);
        pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
            0, 0, 0, 0, "-tags", 3, tags);

        sprintf(tag, "%lxBUT", x);
        sprintf(tag_n, "%lxBUT%d", x, i);
        pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
            0, 0, 0, 0, "-tags", 3, tags);
    }
    /* make sure the buttons are above their base */
    sprintf(tag, "%lxBUT", x);
    sprintf(tag_n, "%lxBASE", x);
    pdgui_vmess(0, "crss", canvas, "raise", tag, tag_n);

    sprintf(tag, "%lxLABEL", x);
    sprintf(tag_n, "label");
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 4, tags);

    radio_draw_config(x, glist);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_IO);
}